

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_variable_declaration
                    (gravity_parser_t *parser,_Bool isstatement,gtoken_t access_specifier,
                    gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer_00;
  size_t sVar1;
  gtoken_s token_00;
  gtoken_s token_01;
  _Bool _Var2;
  gtoken_t gVar3;
  char *pcVar4;
  gnode_r *pgVar5;
  char *annotation_type;
  uint16_t *puVar6;
  gnode_t *pgVar7;
  gnode_t **ppgVar8;
  size_t local_188;
  gnode_t *local_180;
  size_t local_160;
  gnode_t *local_158;
  bool local_131;
  undefined1 local_130 [7];
  _Bool is_computed;
  gnode_variable_decl_t *local_108;
  gnode_variable_decl_t *node;
  gtoken_s local_d8;
  undefined8 uStack_b0;
  gtoken_s token2;
  gtoken_s token;
  gtoken_t peek;
  gtoken_t type;
  char *type_annotation;
  char *identifier;
  gnode_t *expr;
  gnode_t *decl;
  gnode_r *decls;
  gravity_lexer_t *lexer;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  _Bool isstatement_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_next(lexer_00);
  _Var2 = token_isvariable_declaration(gVar3);
  if (_Var2) {
    gravity_lexer_token((gtoken_s *)&node,lexer_00);
    memcpy(&token2.value,&node,0x28);
    if (parser->declarations->n == 0) {
      local_158 = (gnode_t *)0x0;
    }
    else {
      local_158 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_00.colno = token.type;
    token_00._0_8_ = token2.value;
    token_00.position = token.lineno;
    token_00.bytes = token.colno;
    token_00.length = token.position;
    token_00.fileid = token.bytes;
    token_00.builtin = token.length;
    token_00.value = (char *)token._24_8_;
    local_108 = (gnode_variable_decl_t *)
                gnode_variable_decl_create
                          (token_00,gVar3,access_specifier,storage_specifier,(gnode_r *)0x0,
                           local_158);
    pgVar5 = gnode_array_create();
    while (pcVar4 = parse_identifier(parser), pcVar4 != (char *)0x0) {
      gravity_lexer_token((gtoken_s *)local_130,lexer_00);
      memcpy(&uStack_b0,local_130,0x28);
      annotation_type = parse_optional_type_annotation(parser);
      if (((annotation_type != (char *)0x0) && (parser->delegate != (gravity_delegate_t *)0x0)) &&
         (parser->delegate->type_callback != (gravity_type_callback)0x0)) {
        (*parser->delegate->type_callback)(&uStack_b0,annotation_type,parser->delegate->xdata);
      }
      identifier = (char *)0x0;
      local_131 = false;
      gVar3 = gravity_lexer_peek(lexer_00);
      _Var2 = token_isvariable_assignment(gVar3);
      if (_Var2) {
        gravity_lexer_next(lexer_00);
        if ((parser->vdecl).n == (parser->vdecl).m) {
          if ((parser->vdecl).m == 0) {
            local_160 = 8;
          }
          else {
            local_160 = (parser->vdecl).m << 1;
          }
          (parser->vdecl).m = local_160;
          puVar6 = (uint16_t *)realloc((parser->vdecl).p,(parser->vdecl).m << 1);
          (parser->vdecl).p = puVar6;
        }
        sVar1 = (parser->vdecl).n;
        (parser->vdecl).n = sVar1 + 1;
        (parser->vdecl).p[sVar1] = 1;
        identifier = (char *)parse_expression(parser);
        (parser->vdecl).n = (parser->vdecl).n - 1;
      }
      else {
        local_131 = gVar3 == TOK_OP_OPEN_CURLYBRACE;
        if (local_131) {
          gravity_lexer_next(lexer_00);
          identifier = (char *)parse_getter_setter(parser);
          parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
        }
      }
      if (parser->declarations->n == 0) {
        local_180 = (gnode_t *)0x0;
      }
      else {
        local_180 = parser->declarations->p[parser->declarations->n - 1];
      }
      token_01.colno = token2.type;
      token_01.type = (undefined4)uStack_b0;
      token_01.lineno = uStack_b0._4_4_;
      token_01.position = token2.lineno;
      token_01.bytes = token2.colno;
      token_01.length = token2.position;
      token_01.fileid = token2.bytes;
      token_01.builtin = token2.length;
      token_01.value = (char *)token2._24_8_;
      pgVar7 = gnode_variable_create
                         (token_01,pcVar4,annotation_type,(gnode_t *)identifier,local_180,local_108)
      ;
      if (pgVar7 != (gnode_t *)0x0) {
        *(bool *)((long)&pgVar7[1].token.length + 3) = local_131;
        if (pgVar5->n == pgVar5->m) {
          if (pgVar5->m == 0) {
            local_188 = 8;
          }
          else {
            local_188 = pgVar5->m << 1;
          }
          pgVar5->m = local_188;
          ppgVar8 = (gnode_t **)realloc(pgVar5->p,pgVar5->m << 3);
          pgVar5->p = ppgVar8;
        }
        sVar1 = pgVar5->n;
        pgVar5->n = sVar1 + 1;
        pgVar5->p[sVar1] = pgVar7;
      }
      gVar3 = gravity_lexer_peek(lexer_00);
      if (gVar3 != TOK_OP_COMMA) {
        if (isstatement) {
          parse_semicolon(parser);
        }
        local_108->decls = pgVar5;
        return &local_108->base;
      }
      gravity_lexer_next(lexer_00);
    }
  }
  else {
    gravity_lexer_token(&local_d8,lexer_00);
    pcVar4 = token_name(gVar3);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x170f05,pcVar4);
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_variable_declaration (gravity_parser_t *parser, bool isstatement, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DEBUG_PARSER("parse_variable_declaration");
    DECLARE_LEXER;

    gnode_r *decls = NULL;
    gnode_t *decl = NULL;
    gnode_t *expr = NULL;
    const char *identifier = NULL;
    const char *type_annotation = NULL;
    gtoken_t type;
    gtoken_t peek;
    gtoken_s token, token2;

    // access_specifier? storage_specifier? variable_declaration ';'
    // variable_declaration: variable_declarator decl_item
    // variable_declarator: 'const' | 'var'
    // decl_item: (IDENTIFIER assignment?) (',' IDENTIFIER assignment?)*
    // assignment

    // sanity check on variable type
    type = gravity_lexer_next(lexer);
    if (!token_isvariable_declaration(type)) {
        REPORT_ERROR(gravity_lexer_token(lexer), "VAR or CONST expected here but found %s.", token_name(type));
        return NULL;
    }
    token = gravity_lexer_token(lexer);

    // create node variable declaration
    gnode_variable_decl_t *node = (gnode_variable_decl_t *) gnode_variable_decl_create(token, type, access_specifier, storage_specifier, NULL, LAST_DECLARATION());

    // initialize node array
    decls = gnode_array_create();

loop:
    identifier = parse_identifier(parser);
    if (!identifier) return NULL;
    token2 = gravity_lexer_token(lexer);

    // type annotation is optional so it can be NULL
    type_annotation = parse_optional_type_annotation(parser);
    DEBUG_PARSER("IDENTIFIER: %s %s", identifier, (type_annotation) ? type_annotation : "");
    if (type_annotation && parser->delegate && parser->delegate->type_callback) {
        parser->delegate->type_callback(&token2, type_annotation, parser->delegate->xdata);
    }

    // check for optional assignment or getter/setter declaration (ONLY = is ALLOWED here!)
    expr = NULL;
    bool is_computed = false;
    peek = gravity_lexer_peek(lexer);
    if (token_isvariable_assignment(peek)) {
        gravity_lexer_next(lexer); // consume ASSIGNMENT
        marray_push(uint16_t, parser->vdecl, 1);
        expr = parse_expression(parser);
        marray_pop(parser->vdecl);
    } else if (peek == TOK_OP_OPEN_CURLYBRACE) {
        gravity_lexer_next(lexer); // consume TOK_OP_OPEN_CURLYBRACE
        expr = parse_getter_setter(parser);
        parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);
        is_computed = true;
    }

    // sanity checks
    // 1. CONST must be followed by an assignment expression ?
    // 2. check if identifier is unique inside variable declarations

    decl = gnode_variable_create(token2, identifier, type_annotation, expr, LAST_DECLARATION(), node);
    if (decl) {
        ((gnode_var_t *)decl)->iscomputed = is_computed;
        gnode_array_push(decls, decl);
    }

    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA
        goto loop;
    }

    // check and consume TOK_OP_SEMICOLON (ALWAYS required for assignments)
    // Aaron: I would keep it consistent, even if it's not strictly required.
    // Otherwise we end up with all of JavaScript's terrible ideas. ;-)
    // So I would require the semicolon at the end of any assignment statement.
    if (isstatement) parse_semicolon(parser);

    // finish to setup declaration
    node->decls = decls;

    return (gnode_t *)node;
}